

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall Liby::http::HttpClient::get(HttpClient *this,Request *request,ReplyHandler *handler)

{
  pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_> pStack_d8;
  
  std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>::
  pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>,_true>
            (&pStack_d8,request,handler);
  std::__cxx11::
  list<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>,std::allocator<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>>
  ::emplace_back<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>
            ((list<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>,std::allocator<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>>
              *)&this->requestLists_,&pStack_d8);
  std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>::~pair(&pStack_d8);
  if ((this->http_conn_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    sendRequest(this);
  }
  return;
}

Assistant:

void Liby::http::HttpClient::get(const Request &request,
                                 const ReplyHandler &handler) {
    requestLists_.emplace_back(std::make_pair(request, handler));
    if (http_conn_)
        sendRequest();
}